

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_color_quantizer *pjVar2;
  long lVar3;
  jpeg_error_mgr *pjVar4;
  JSAMPARRAY ppJVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  
  pjVar2 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar2;
  pjVar2->start_pass = start_pass_1_quant;
  pjVar2->finish_pass = finish_pass_1_quant;
  pjVar2->new_color_map = new_color_map_1_quant;
  pjVar2[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (0x100 < cinfo->desired_number_of_colors) {
    *(undefined8 *)&cinfo->err->msg_code = 0x1000000003b;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar2 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  lVar16 = (long)cinfo->desired_number_of_colors;
  uVar8 = 1;
  do {
    uVar7 = uVar8;
    uVar8 = uVar7 + 1;
    uVar6 = uVar8;
    iVar12 = uVar1 - 1;
    if (1 < (int)uVar1) {
      do {
        uVar6 = uVar6 * uVar8;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
  } while ((long)uVar6 <= lVar16);
  if (uVar7 < 2) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x3a;
    (pjVar4->msg_parm).i[0] = (int)uVar6;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar10 = 1;
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      *(int *)((long)&pjVar2[1].new_color_map + uVar8 * 4 + 4) = (int)uVar7;
      uVar10 = uVar10 * (int)uVar7;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  do {
    bVar11 = true;
    if (0 < (int)uVar1) {
      piVar14 = &select_ncolors_RGB_order;
      uVar8 = 0;
      do {
        if (cinfo->out_color_space == JCS_RGB) {
          iVar12 = *piVar14;
        }
        else {
          iVar12 = (int)uVar8;
        }
        iVar13 = *(int *)((long)&pjVar2[1].new_color_map + (long)iVar12 * 4 + 4);
        lVar15 = (long)iVar13 + 1;
        lVar3 = ((int)uVar10 / iVar13) * lVar15;
        if (lVar3 - lVar16 != 0 && lVar16 <= lVar3) break;
        *(int *)((long)&pjVar2[1].new_color_map + (long)iVar12 * 4 + 4) = (int)lVar15;
        uVar8 = uVar8 + 1;
        piVar14 = piVar14 + 1;
        bVar11 = false;
        uVar10 = (uint)lVar3;
      } while (uVar1 != uVar8);
    }
    if (bVar11) {
      pjVar4 = cinfo->err;
      if (cinfo->out_color_components == 3) {
        (pjVar4->msg_parm).i[0] = uVar10;
        (pjVar4->msg_parm).i[1] = *(int *)((long)&pjVar2[1].new_color_map + 4);
        (pjVar4->msg_parm).i[2] = *(int *)&pjVar2[2].start_pass;
        (pjVar4->msg_parm).i[3] = *(int *)((long)&pjVar2[2].start_pass + 4);
        pjVar4->msg_code = 0x60;
      }
      else {
        pjVar4->msg_code = 0x61;
        (pjVar4->msg_parm).i[0] = uVar10;
        pjVar4 = cinfo->err;
      }
      (*pjVar4->emit_message)((j_common_ptr)cinfo,1);
      ppJVar5 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,uVar10,cinfo->out_color_components);
      if (0 < cinfo->out_color_components) {
        lVar16 = 0;
        uVar8 = (ulong)uVar10;
        do {
          iVar12 = *(int *)((long)&pjVar2[1].new_color_map + lVar16 * 4 + 4);
          lVar3 = (long)iVar12;
          iVar13 = (int)uVar8;
          uVar6 = (long)iVar13 / (long)iVar12;
          uVar8 = uVar6 & 0xffffffff;
          iVar12 = (int)uVar6;
          if (0 < lVar3) {
            uVar7 = lVar3 - 1;
            lVar15 = 0;
            lVar17 = 0;
            do {
              if (lVar15 * iVar12 < (long)(int)uVar10) {
                lVar9 = lVar17;
                do {
                  if (0 < iVar12) {
                    uVar18 = 0;
                    do {
                      ppJVar5[lVar16][uVar18 + lVar9] =
                           (JSAMPLE)((lVar15 * 0xff +
                                     (long)((int)(((uint)(uVar7 >> 0x1f) & 1) + (int)uVar7) >> 1)) /
                                    (long)uVar7);
                      uVar18 = uVar18 + 1;
                    } while ((uVar6 & 0xffffffff) != uVar18);
                  }
                  lVar9 = lVar9 + iVar13;
                } while (lVar9 < (int)uVar10);
              }
              lVar15 = lVar15 + 1;
              lVar17 = lVar17 + iVar12;
            } while (lVar15 != lVar3);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < cinfo->out_color_components);
      }
      pjVar2[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar5;
      *(uint *)&pjVar2[1].color_quantize = uVar10;
      create_colorindex(cinfo);
      if (cinfo->dither_mode != JDITHER_FS) {
        return;
      }
      alloc_fs_workspace(cinfo);
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *) cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL;	/* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE+1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE+1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it is FAR storage and may affect the memory
   * manager's space calculations.  If the user changes to FS dither
   * mode in a later pass, we will allocate the space then, and will
   * possibly overrun the max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}